

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O3

set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> * __thiscall
spvtools::val::ValidationState_t::EntryPointReferences
          (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
           *__return_storage_ptr__,ValidationState_t *this,uint32_t id)

{
  _Rb_tree_header *__position;
  pointer ppVar1;
  pointer puVar2;
  const_iterator cVar3;
  const_iterator cVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  Instruction *pIVar5;
  pointer ppVar6;
  vector<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
  stack;
  vector<unsigned_int,_std::allocator<unsigned_int>_> function_entry_points;
  Instruction *inst;
  Instruction **local_88;
  iterator iStack_80;
  Instruction **local_78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_48;
  Instruction *local_40;
  _Alloc_node local_38;
  
  __position = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &__position->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &__position->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88 = (Instruction **)CONCAT44(local_88._4_4_,id);
  cVar3 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->all_definitions_)._M_h,(key_type *)&local_88);
  if ((cVar3.
       super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
       ._M_cur != (__node_type *)0x0) &&
     (local_40 = *(Instruction **)
                  ((long)cVar3.
                         super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
                         ._M_cur + 0x10), local_40 != (Instruction *)0x0)) {
    local_88 = (Instruction **)0x0;
    iStack_80._M_current = (Instruction **)0x0;
    local_78 = (Instruction **)0x0;
    std::vector<spvtools::val::Instruction_const*,std::allocator<spvtools::val::Instruction_const*>>
    ::_M_realloc_insert<spvtools::val::Instruction_const*const&>
              ((vector<spvtools::val::Instruction_const*,std::allocator<spvtools::val::Instruction_const*>>
                *)&local_88,(iterator)0x0,&local_40);
    if (local_88 != iStack_80._M_current) {
      local_50 = &(this->function_to_entry_points_)._M_h;
      local_48 = &this->empty_ids_;
      do {
        pIVar5 = iStack_80._M_current[-1];
        iStack_80._M_current = iStack_80._M_current + -1;
        if (pIVar5->function_ == (Function *)0x0) {
          ppVar1 = (pIVar5->uses_).
                   super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (ppVar6 = (pIVar5->uses_).
                        super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start; ppVar6 != ppVar1;
              ppVar6 = ppVar6 + 1) {
            local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)ppVar6->first;
            if (iStack_80._M_current == local_78) {
              std::
              vector<spvtools::val::Instruction_const*,std::allocator<spvtools::val::Instruction_const*>>
              ::_M_realloc_insert<spvtools::val::Instruction_const*const&>
                        ((vector<spvtools::val::Instruction_const*,std::allocator<spvtools::val::Instruction_const*>>
                          *)&local_88,iStack_80,(Instruction **)&local_68);
            }
            else {
              *iStack_80._M_current =
                   (Instruction *)
                   local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
              iStack_80._M_current = iStack_80._M_current + 1;
            }
          }
        }
        else {
          local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_68.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,
                                 pIVar5->function_->id_);
          cVar4 = std::
                  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(local_50,(key_type *)&local_68);
          __x = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                ((long)cVar4.
                       super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
                       ._M_cur + 0x10);
          if (cVar4.
              super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
              ._M_cur == (__node_type *)0x0) {
            __x = local_48;
          }
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_68,__x);
          puVar2 = local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          local_38._M_t = &__return_storage_ptr__->_M_t;
          for (pIVar5 = (Instruction *)
                        local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start; pIVar5 != (Instruction *)puVar2;
              pIVar5 = (Instruction *)
                       ((long)&(pIVar5->words_).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start + 4)) {
            std::
            _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
            ::
            _M_insert_unique_<unsigned_int_const&,std::_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>::_Alloc_node>
                      ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                        *)__return_storage_ptr__,(const_iterator)__position,(uint *)pIVar5,&local_38
                      );
          }
          if ((Instruction *)
              local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (Instruction *)0x0) {
            operator_delete(local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_68.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_68.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
        }
      } while (local_88 != iStack_80._M_current);
    }
    if (local_88 != (Instruction **)0x0) {
      operator_delete(local_88,(long)local_78 - (long)local_88);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<uint32_t> ValidationState_t::EntryPointReferences(uint32_t id) const {
  std::set<uint32_t> referenced_entry_points;
  const auto inst = FindDef(id);
  if (!inst) return referenced_entry_points;

  std::vector<const Instruction*> stack;
  stack.push_back(inst);
  while (!stack.empty()) {
    const auto current_inst = stack.back();
    stack.pop_back();

    if (const auto func = current_inst->function()) {
      // Instruction lives in a function, we can stop searching.
      const auto function_entry_points = FunctionEntryPoints(func->id());
      referenced_entry_points.insert(function_entry_points.begin(),
                                     function_entry_points.end());
    } else {
      // Instruction is in the global scope, keep searching its uses.
      for (auto pair : current_inst->uses()) {
        const auto next_inst = pair.first;
        stack.push_back(next_inst);
      }
    }
  }

  return referenced_entry_points;
}